

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

int __thiscall Js::InterpreterStackFrame::ProcessFinally(InterpreterStackFrame *this)

{
  bool bVar1;
  int iVar2;
  void *pointer;
  
  *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    pointer = DebugProcess(this);
  }
  else {
    pointer = Process(this);
  }
  iVar2 = ::Math::PointerCastToIntegral<int>(pointer);
  return iVar2;
}

Assistant:

int InterpreterStackFrame::ProcessFinally()
    {
        this->nestedFinallyDepth++;

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        return newOffset;
    }